

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O1

int dobindkey(KEYMAP *map,char *func,char *str)

{
  byte bVar1;
  buffer *pbVar2;
  int iVar3;
  __int32_t **pp_Var4;
  char *pcVar5;
  char cVar6;
  undefined8 in_RCX;
  ulong uVar7;
  undefined6 uVar8;
  KCHAR *keys;
  KCHAR *pKVar9;
  bool bVar10;
  KEYMAP *local_40;
  KEYMAP *map_local;
  
  pbVar2 = curbp;
  uVar7 = CONCAT71((int7)((ulong)in_RCX >> 8),*str);
  iVar3 = (int)uVar7;
  local_40 = map;
  if (*str == '\0') {
    keys = (KCHAR *)0x0;
  }
  else {
    pKVar9 = (KCHAR *)0x0;
    map_local = (KEYMAP *)func;
    do {
      cVar6 = (char)uVar7;
      if (cVar6 == '\\') {
LAB_0010dd2c:
        pcVar5 = str + 1;
        bVar1 = str[1];
        uVar8 = (undefined6)(uVar7 >> 0x10);
        if (bVar1 < 0x5c) {
          if (bVar1 < 0x4e) {
            if (bVar1 == 0) goto LAB_0010dd8e;
            if (bVar1 != 0x45) goto LAB_0010ddb5;
LAB_0010dd88:
            uVar7 = CONCAT62((int6)(uVar7 >> 0x10),0x1b);
          }
          else if (bVar1 == 0x4e) {
LAB_0010dd99:
            uVar7 = (ulong)(uint)(int)*pbVar2->b_nlchr;
          }
          else if (bVar1 == 0x52) {
LAB_0010dd93:
            uVar7 = CONCAT62(uVar8,0xd);
          }
          else {
            if (bVar1 != 0x54) goto LAB_0010ddb5;
LAB_0010dd79:
            uVar7 = CONCAT62(uVar8,9);
          }
          goto LAB_0010ddac;
        }
        if (bVar1 < 0x6e) {
          if (bVar1 == 0x5c) {
            uVar7 = CONCAT62(uVar8,0x5c);
          }
          else {
            uVar7 = CONCAT62(uVar8,0x5e);
            if (bVar1 != 0x5e) {
              if (bVar1 == 0x65) goto LAB_0010dd88;
              goto LAB_0010ddb5;
            }
          }
          goto LAB_0010ddac;
        }
        if (bVar1 == 0x6e) goto LAB_0010dd99;
        if (bVar1 == 0x72) goto LAB_0010dd93;
        if (bVar1 == 0x74) goto LAB_0010dd79;
      }
      else {
        if (((uint)uVar7 & 0xff) == 0x5e) {
          bVar1 = str[1];
          if ((ulong)bVar1 != 0) {
            pp_Var4 = __ctype_toupper_loc();
            uVar7 = (ulong)((*pp_Var4)[bVar1] ^ 0x40);
            pcVar5 = str + 1;
            goto LAB_0010ddac;
          }
          if (cVar6 == '\\') goto LAB_0010dd2c;
        }
LAB_0010dd8e:
        uVar7 = (ulong)(uint)(int)cVar6;
        pcVar5 = str;
LAB_0010ddac:
        key.k_chars[(long)pKVar9] = (KCHAR)uVar7;
      }
LAB_0010ddb5:
      keys = (KCHAR *)((long)pKVar9 + 1);
      uVar7 = CONCAT71((int7)(uVar7 >> 8),pcVar5[1]);
      iVar3 = (int)uVar7;
      func = (char *)map_local;
    } while ((pcVar5[1] != '\0') &&
            (str = pcVar5 + 1, bVar10 = pKVar9 < (KCHAR *)0x7, pKVar9 = keys, bVar10));
  }
  key.k_count = (int)keys;
  iVar3 = bindkey(&local_40,func,keys,iVar3);
  return iVar3;
}

Assistant:

int
dobindkey(KEYMAP *map, const char *func, const char *str)
{
	int	 i;

	for (i = 0; *str && i < MAXKEY; i++) {
		/* XXX - convert numbers w/ strol()? */
		if (*str == '^' && *(str + 1) !=  '\0') {
			key.k_chars[i] = CCHR(toupper((unsigned char)*++str));
		} else if (*str == '\\' && *(str + 1) != '\0') {
			switch (*++str) {
			case '^':
				key.k_chars[i] = '^';
				break;
			case 't':
			case 'T':
				key.k_chars[i] = '\t';
				break;
			case 'n':
			case 'N':
				key.k_chars[i] = *curbp->b_nlchr;
				break;
			case 'r':
			case 'R':
				key.k_chars[i] = '\r';
				break;
			case 'e':
			case 'E':
				key.k_chars[i] = CCHR('[');
				break;
			case '\\':
				key.k_chars[i] = '\\';
				break;
			}
		} else
			key.k_chars[i] = *str;
		str++;
	}
	key.k_count = i;
	return (bindkey(&map, func, key.k_chars, key.k_count));
}